

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::MultD(Forth *this)

{
  uint uVar1;
  uint uVar2;
  ForthStack<unsigned_int> *this_00;
  
  requireDStackDepth(this,2,"M*");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  ForthStack<unsigned_int>::setTop(this_00,1,(uint)((long)(int)uVar1 * (long)(int)uVar2));
  ForthStack<unsigned_int>::setTop
            (this_00,0,(uint)((ulong)((long)(int)uVar1 * (long)(int)uVar2) >> 0x20));
  return;
}

Assistant:

void MultD(){
			REQUIRE_DSTACK_DEPTH(2, "M*");
			SDCell n1{ static_cast<SCell>(dStack.getTop()) };
			SDCell n2{ static_cast<SCell>(dStack.getTop(1)) };
			n1.data_.Dcells *= n2.data_.Dcells;
			dStack.setTop(1, n1.data_.Cells.lo);
			dStack.setTop(0, n1.data_.Cells.hi);
		}